

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

QTransform * __thiscall
QPainterPrivate::viewTransform(QTransform *__return_storage_ptr__,QPainterPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  QPainterState *pQVar9;
  long lVar10;
  qreal *pqVar11;
  qreal *pqVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pQVar9 = (this->state)._M_t.
           super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
           super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
           super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
  if ((pQVar9->field_0x1a0 & 2) == 0) {
    pqVar11 = (qreal *)&DAT_0069f560;
    pqVar12 = (qreal *)__return_storage_ptr__;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *pqVar12 = *pqVar11;
      pqVar11 = pqVar11 + 1;
      pqVar12 = pqVar12 + 1;
    }
    *(ushort *)&__return_storage_ptr__->field_0x48 =
         *(ushort *)&__return_storage_ptr__->field_0x48 & 0xfc00;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->m_matrix[0][1] = 0.0;
  __return_storage_ptr__->m_matrix[0][2] = 0.0;
  __return_storage_ptr__->m_matrix[1][0] = 0.0;
  __return_storage_ptr__->m_matrix[1][2] = 0.0;
  uVar1 = pQVar9->vw;
  uVar5 = pQVar9->vh;
  auVar13._0_8_ = (double)(int)uVar1;
  auVar13._8_8_ = (double)(int)uVar5;
  uVar2 = pQVar9->ww;
  uVar6 = pQVar9->wh;
  uVar3 = pQVar9->vx;
  uVar7 = pQVar9->vy;
  auVar14._8_8_ = (double)(int)uVar6;
  auVar14._0_8_ = (double)(int)uVar2;
  auVar14 = divpd(auVar13,auVar14);
  uVar4 = pQVar9->wx;
  uVar8 = pQVar9->wy;
  __return_storage_ptr__->m_matrix[0][0] = auVar14._0_8_;
  __return_storage_ptr__->m_matrix[1][1] = auVar14._8_8_;
  __return_storage_ptr__->m_matrix[2][0] = (double)(int)uVar3 - (double)(int)uVar4 * auVar14._0_8_;
  __return_storage_ptr__->m_matrix[2][1] = (double)(int)uVar7 - (double)(int)uVar8 * auVar14._8_8_;
  __return_storage_ptr__->m_matrix[2][2] = 1.0;
  *(ushort *)&__return_storage_ptr__->field_0x48 =
       (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x48 & 0xfc00 | 0x100;
  return __return_storage_ptr__;
}

Assistant:

QTransform QPainterPrivate::viewTransform() const
{
    if (state->VxF) {
        qreal scaleW = qreal(state->vw)/qreal(state->ww);
        qreal scaleH = qreal(state->vh)/qreal(state->wh);
        return QTransform(scaleW, 0, 0, scaleH,
                          state->vx - state->wx*scaleW, state->vy - state->wy*scaleH);
    }
    return QTransform();
}